

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweeper.c
# Opt level: O2

int Gia_SweeperFraig(Gia_Man_t *p,Vec_Int_t *vProbeIds,char *pCommLime,int nWords,int nConfs,
                    int fVerify,int fVerbose)

{
  int ProbeId;
  int iLitNew;
  Gia_Man_t *pNew;
  Abc_Frame_t *pAVar1;
  Vec_Int_t *p_00;
  int iVar2;
  
  if (p->pData != (void *)0x0) {
    pNew = Gia_SweeperSweep(p,vProbeIds,nWords,nConfs,fVerify,fVerbose);
    if (pNew == (Gia_Man_t *)0x0) {
      iVar2 = 0;
    }
    else {
      if (pCommLime != (char *)0x0) {
        pAVar1 = Abc_FrameGetGlobalFrame();
        Abc_FrameUpdateGia(pAVar1,pNew);
        pAVar1 = Abc_FrameGetGlobalFrame();
        Cmd_CommandExecute(pAVar1,pCommLime);
        pAVar1 = Abc_FrameGetGlobalFrame();
        pNew = Abc_FrameGetGia(pAVar1);
      }
      p_00 = Gia_SweeperGraft(p,(Vec_Int_t *)0x0,pNew);
      Gia_ManStop(pNew);
      for (iVar2 = 0; iVar2 < vProbeIds->nSize; iVar2 = iVar2 + 1) {
        ProbeId = Vec_IntEntry(vProbeIds,iVar2);
        iLitNew = Vec_IntEntry(p_00,iVar2);
        Gia_SweeperProbeUpdate(p,ProbeId,iLitNew);
      }
      Vec_IntFree(p_00);
      iVar2 = 1;
    }
    return iVar2;
  }
  __assert_fail("Gia_SweeperIsRunning(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweeper.c"
                ,0x42e,"int Gia_SweeperFraig(Gia_Man_t *, Vec_Int_t *, char *, int, int, int, int)")
  ;
}

Assistant:

int Gia_SweeperFraig( Gia_Man_t * p, Vec_Int_t * vProbeIds, char * pCommLime, int nWords, int nConfs, int fVerify, int fVerbose )
{
    Gia_Man_t * pNew;
    Vec_Int_t * vLits;
    int ProbeId, i;
    // sweeper is running
    assert( Gia_SweeperIsRunning(p) );
    // sweep the logic
    pNew = Gia_SweeperSweep( p, vProbeIds, nWords, nConfs, fVerify, fVerbose );
    if ( pNew == NULL )
        return 0;
    // execute command line
    if ( pCommLime )
    {
        // set pNew to be current GIA in ABC
        Abc_FrameUpdateGia( Abc_FrameGetGlobalFrame(), pNew );
        // execute command line pCommLine using Abc_CmdCommandExecute()
        Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), pCommLime );
        // get pNew to be current GIA in ABC     
        pNew = Abc_FrameGetGia( Abc_FrameGetGlobalFrame() );
    }
    // return logic back into the main manager
    vLits = Gia_SweeperGraft( p, NULL, pNew );
    Gia_ManStop( pNew );
    // update the array of probes
    Vec_IntForEachEntry( vProbeIds, ProbeId, i )
        Gia_SweeperProbeUpdate( p, ProbeId, Vec_IntEntry(vLits, i) );
    Vec_IntFree( vLits );        
    return 1;
}